

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5CursorFirst(Fts5FullTable *pTab,Fts5Cursor *pCsr,int bDesc)

{
  Fts5Expr *p;
  int iVar1;
  int iVar2;
  Fts5Expr *pExpr;
  int rc;
  int bDesc_local;
  Fts5Cursor *pCsr_local;
  Fts5FullTable *pTab_local;
  
  p = pCsr->pExpr;
  iVar1 = sqlite3Fts5ExprFirst(p,(pTab->p).pIndex,pCsr->iFirstRowid,bDesc);
  iVar2 = sqlite3Fts5ExprEof(p);
  if (iVar2 != 0) {
    pCsr->csrflags = pCsr->csrflags | 1;
  }
  fts5CsrNewrow(pCsr);
  return iVar1;
}

Assistant:

static int fts5CursorFirst(Fts5FullTable *pTab, Fts5Cursor *pCsr, int bDesc){
  int rc;
  Fts5Expr *pExpr = pCsr->pExpr;
  rc = sqlite3Fts5ExprFirst(pExpr, pTab->p.pIndex, pCsr->iFirstRowid, bDesc);
  if( sqlite3Fts5ExprEof(pExpr) ){
    CsrFlagSet(pCsr, FTS5CSR_EOF);
  }
  fts5CsrNewrow(pCsr);
  return rc;
}